

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

LogicalType * __thiscall duckdb::ColumnData::RootType(ColumnData *this)

{
  for (; (this->parent).ptr != (ColumnData *)0x0;
      this = optional_ptr<duckdb::ColumnData,_true>::operator->(&this->parent)) {
  }
  return &this->type;
}

Assistant:

const LogicalType &ColumnData::RootType() const {
	if (parent) {
		return parent->RootType();
	}
	return type;
}